

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

int __thiscall mario::EPoller::poll(EPoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int __epfd;
  epoll_event *__events;
  size_type sVar1;
  Writer *pWVar2;
  size_type sVar3;
  Writer local_1a8;
  Writer local_130;
  Writer local_a8;
  int local_2c;
  ChannelList *pCStack_28;
  int numEvents;
  ChannelList *activeChannels_local;
  EPoller *pEStack_18;
  int timeoutMs_local;
  EPoller *this_local;
  Timestamp now;
  
  activeChannels_local._4_4_ = (int)__fds;
  __epfd = this->_epollfd;
  pCStack_28 = (ChannelList *)__nfds;
  pEStack_18 = this;
  __events = (epoll_event *)
             std::vector<epoll_event,_std::allocator<epoll_event>_>::data(&this->_events);
  sVar1 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->_events);
  local_2c = epoll_wait(__epfd,__events,(int)sVar1,activeChannels_local._4_4_);
  this_local = (EPoller *)Timestamp::now();
  if (local_2c < 1) {
    if (local_2c == 0) {
      el::base::Writer::Writer
                (&local_130,Info,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
                 ,0x2c,"Timestamp mario::EPoller::poll(int, ChannelList *)",NormalLog,0);
      pWVar2 = el::base::Writer::construct(&local_130,1,el::base::consts::kDefaultLoggerId);
      el::base::Writer::operator<<(pWVar2,(char (*) [18])"nothing happended");
      el::base::Writer::~Writer(&local_130);
    }
    else {
      el::base::Writer::Writer
                (&local_1a8,Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
                 ,0x2e,"Timestamp mario::EPoller::poll(int, ChannelList *)",NormalLog,0);
      pWVar2 = el::base::Writer::construct(&local_1a8,1,el::base::consts::kDefaultLoggerId);
      el::base::Writer::operator<<(pWVar2,(char (*) [16])"EPoller::poll()");
      el::base::Writer::~Writer(&local_1a8);
    }
  }
  else {
    el::base::Writer::Writer
              (&local_a8,Info,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
               ,0x26,"Timestamp mario::EPoller::poll(int, ChannelList *)",NormalLog,0);
    pWVar2 = el::base::Writer::construct(&local_a8,1,el::base::consts::kDefaultLoggerId);
    pWVar2 = el::base::Writer::operator<<(pWVar2,&local_2c);
    el::base::Writer::operator<<(pWVar2,(char (*) [17])"events happended");
    el::base::Writer::~Writer(&local_a8);
    fillActiveChannels(this,local_2c,pCStack_28);
    sVar1 = (size_type)local_2c;
    sVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->_events);
    if (sVar1 == sVar3) {
      sVar1 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->_events);
      std::vector<epoll_event,_std::allocator<epoll_event>_>::resize(&this->_events,sVar1 << 1);
    }
  }
  return (int)this_local;
}

Assistant:

Timestamp EPoller::poll(int timeoutMs, ChannelList* activeChannels) {
    int numEvents = ::epoll_wait(_epollfd,
            _events.data(),
            _events.size(),
            timeoutMs);
    Timestamp now(Timestamp::now());
    if (numEvents > 0) {
        LOG(INFO) << numEvents << "events happended";
        fillActiveChannels(numEvents, activeChannels);
        if (numEvents == _events.size()) {
            _events.resize(_events.size() * 2);
        }
    } else if (numEvents == 0) {
        LOG(INFO) << "nothing happended";
    } else {
        LOG(FATAL) << "EPoller::poll()";
    }
    return now;
}